

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_msa_ld_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  tcg_target_ulong tVar1;
  TCGMemOpIdx oi;
  long lVar2;
  uintptr_t unaff_retaddr;
  
  lVar2 = (ulong)wd * 0x10;
  oi = 0x783;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0x780;
  }
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr,oi,unaff_retaddr);
  *(char *)((env->active_fpu).fpr + wd) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 1,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 1) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 2,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 2) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 3,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 3) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 4,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 4) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 5,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 5) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 6,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 6) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 7,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 7) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 8,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 8) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 9,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 9) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 10,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 10) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 0xb,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xb) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 0xc,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 0xd,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xd) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 0xe,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = (char)tVar1;
  tVar1 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict11 *)env,addr + 0xf,oi,unaff_retaddr);
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xf) = (char)tVar1;
  return;
}

Assistant:

void helper_msa_ld_b(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    MEMOP_IDX(DF_BYTE)
#if !defined(HOST_WORDS_BIGENDIAN)
    pwd->b[0]  = helper_ret_ldub_mmu(env, addr + (0  << DF_BYTE), oi, GETPC());
    pwd->b[1]  = helper_ret_ldub_mmu(env, addr + (1  << DF_BYTE), oi, GETPC());
    pwd->b[2]  = helper_ret_ldub_mmu(env, addr + (2  << DF_BYTE), oi, GETPC());
    pwd->b[3]  = helper_ret_ldub_mmu(env, addr + (3  << DF_BYTE), oi, GETPC());
    pwd->b[4]  = helper_ret_ldub_mmu(env, addr + (4  << DF_BYTE), oi, GETPC());
    pwd->b[5]  = helper_ret_ldub_mmu(env, addr + (5  << DF_BYTE), oi, GETPC());
    pwd->b[6]  = helper_ret_ldub_mmu(env, addr + (6  << DF_BYTE), oi, GETPC());
    pwd->b[7]  = helper_ret_ldub_mmu(env, addr + (7  << DF_BYTE), oi, GETPC());
    pwd->b[8]  = helper_ret_ldub_mmu(env, addr + (8  << DF_BYTE), oi, GETPC());
    pwd->b[9]  = helper_ret_ldub_mmu(env, addr + (9  << DF_BYTE), oi, GETPC());
    pwd->b[10] = helper_ret_ldub_mmu(env, addr + (10 << DF_BYTE), oi, GETPC());
    pwd->b[11] = helper_ret_ldub_mmu(env, addr + (11 << DF_BYTE), oi, GETPC());
    pwd->b[12] = helper_ret_ldub_mmu(env, addr + (12 << DF_BYTE), oi, GETPC());
    pwd->b[13] = helper_ret_ldub_mmu(env, addr + (13 << DF_BYTE), oi, GETPC());
    pwd->b[14] = helper_ret_ldub_mmu(env, addr + (14 << DF_BYTE), oi, GETPC());
    pwd->b[15] = helper_ret_ldub_mmu(env, addr + (15 << DF_BYTE), oi, GETPC());
#else
    pwd->b[0]  = helper_ret_ldub_mmu(env, addr + (7  << DF_BYTE), oi, GETPC());
    pwd->b[1]  = helper_ret_ldub_mmu(env, addr + (6  << DF_BYTE), oi, GETPC());
    pwd->b[2]  = helper_ret_ldub_mmu(env, addr + (5  << DF_BYTE), oi, GETPC());
    pwd->b[3]  = helper_ret_ldub_mmu(env, addr + (4  << DF_BYTE), oi, GETPC());
    pwd->b[4]  = helper_ret_ldub_mmu(env, addr + (3  << DF_BYTE), oi, GETPC());
    pwd->b[5]  = helper_ret_ldub_mmu(env, addr + (2  << DF_BYTE), oi, GETPC());
    pwd->b[6]  = helper_ret_ldub_mmu(env, addr + (1  << DF_BYTE), oi, GETPC());
    pwd->b[7]  = helper_ret_ldub_mmu(env, addr + (0  << DF_BYTE), oi, GETPC());
    pwd->b[8]  = helper_ret_ldub_mmu(env, addr + (15 << DF_BYTE), oi, GETPC());
    pwd->b[9]  = helper_ret_ldub_mmu(env, addr + (14 << DF_BYTE), oi, GETPC());
    pwd->b[10] = helper_ret_ldub_mmu(env, addr + (13 << DF_BYTE), oi, GETPC());
    pwd->b[11] = helper_ret_ldub_mmu(env, addr + (12 << DF_BYTE), oi, GETPC());
    pwd->b[12] = helper_ret_ldub_mmu(env, addr + (11 << DF_BYTE), oi, GETPC());
    pwd->b[13] = helper_ret_ldub_mmu(env, addr + (10 << DF_BYTE), oi, GETPC());
    pwd->b[14] = helper_ret_ldub_mmu(env, addr + (9  << DF_BYTE), oi, GETPC());
    pwd->b[15] = helper_ret_ldub_mmu(env, addr + (8  << DF_BYTE), oi, GETPC());
#endif
}